

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinarySerializer.cpp
# Opt level: O3

string * __thiscall
ser::BinarySerializer::WriteArray_abi_cxx11_
          (string *__return_storage_ptr__,BinarySerializer *this,void *data,int bytesPerElement,
          int isize,int jsize,int ksize,int lsize,int istride,int jstride,int kstride,int lstride,
          vector<char,_std::allocator<char>_> *binaryData)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  pointer __dest;
  
  std::vector<char,_std::allocator<char>_>::resize
            (binaryData,(long)(ksize * lsize * isize * bytesPerElement * jsize));
  __dest = (binaryData->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < lsize) {
    iVar3 = 0;
    iVar6 = 0;
    do {
      if (0 < ksize) {
        iVar4 = 0;
        iVar2 = iVar3;
        do {
          if (0 < jsize) {
            iVar5 = 0;
            iVar1 = iVar2;
            do {
              uVar7 = (ulong)(uint)isize;
              iVar8 = iVar1;
              if (0 < isize) {
                do {
                  memcpy(__dest,(void *)((long)data + (long)iVar8),(long)bytesPerElement);
                  __dest = __dest + bytesPerElement;
                  iVar8 = iVar8 + istride;
                  uVar7 = uVar7 - 1;
                } while (uVar7 != 0);
              }
              iVar5 = iVar5 + 1;
              iVar1 = iVar1 + jstride;
            } while (iVar5 != jsize);
          }
          iVar4 = iVar4 + 1;
          iVar2 = iVar2 + kstride;
        } while (iVar4 != ksize);
      }
      iVar6 = iVar6 + 1;
      iVar3 = iVar3 + lstride;
    } while (iVar6 != lsize);
    __dest = (binaryData->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
  }
  computeChecksum_abi_cxx11_
            (__return_storage_ptr__,__dest,
             *(int *)&(binaryData->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (int)__dest);
  return __return_storage_ptr__;
}

Assistant:

std::string BinarySerializer::WriteArray(const void* data, int bytesPerElement,
        int isize, int jsize, int ksize, int lsize,
        int istride, int jstride, int kstride, int lstride,
        std::vector<char>& binaryData) const
{
    const char* pData = reinterpret_cast<const char*>(data);

    // Compute data size and reserve memory
    const int dataSize = bytesPerElement * (isize*jsize*ksize*lsize);
    binaryData.resize(dataSize);
    char* pVec = binaryData.data();

    // Write data in column-major (fortran) ordering
    for (int l = 0; l < lsize; ++l)
        for (int k = 0; k < ksize; ++k)
            for (int j = 0; j < jsize; ++j)
                for (int i = 0; i < isize; ++i)
                {
                    const char* pIn = pData + (i*istride + j*jstride + k*kstride + l*lstride);
                    std::memcpy(pVec, pIn, bytesPerElement);
                    pVec += bytesPerElement;
                }

    // Compute checksum
    return computeChecksum(binaryData.data(), binaryData.size());
}